

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  bool bVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  uint *__src;
  ImGuiTabBar **__src_00;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImU32 col;
  uint *__dest;
  ImGuiTabBar **__dest_00;
  int iVar6;
  size_t __nmemb;
  int iVar7;
  uint uVar8;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  bVar1 = pIVar3->SkipItems;
  if (bVar1 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      iVar7 = (pIVar3->IDStack).Size;
      iVar2 = (pIVar3->IDStack).Capacity;
      if (iVar7 == iVar2) {
        iVar7 = iVar7 + 1;
        if (iVar2 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar2 / 2 + iVar2;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        if (iVar2 < iVar7) {
          __dest = (uint *)MemAlloc((long)iVar7 << 2);
          __src = (pIVar3->IDStack).Data;
          if (__src != (uint *)0x0) {
            memcpy(__dest,__src,(long)(pIVar3->IDStack).Size << 2);
            MemFree((pIVar3->IDStack).Data);
          }
          (pIVar3->IDStack).Data = __dest;
          (pIVar3->IDStack).Capacity = iVar7;
        }
      }
      (pIVar3->IDStack).Data[(pIVar3->IDStack).Size] = tab_bar->ID;
      (pIVar3->IDStack).Size = (pIVar3->IDStack).Size + 1;
    }
    iVar7 = (pIVar5->CurrentTabBar).Size;
    iVar2 = (pIVar5->CurrentTabBar).Capacity;
    if (iVar7 == iVar2) {
      iVar7 = iVar7 + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar2 < iVar7) {
        __dest_00 = (ImGuiTabBar **)MemAlloc((long)iVar7 << 3);
        __src_00 = (pIVar5->CurrentTabBar).Data;
        if (__src_00 != (ImGuiTabBar **)0x0) {
          memcpy(__dest_00,__src_00,(long)(pIVar5->CurrentTabBar).Size << 3);
          MemFree((pIVar5->CurrentTabBar).Data);
        }
        (pIVar5->CurrentTabBar).Data = __dest_00;
        (pIVar5->CurrentTabBar).Capacity = iVar7;
      }
    }
    (pIVar5->CurrentTabBar).Data[(pIVar5->CurrentTabBar).Size] = tab_bar;
    (pIVar5->CurrentTabBar).Size = (pIVar5->CurrentTabBar).Size + 1;
    if (tab_bar->CurrFrameVisible != pIVar5->FrameCount) {
      if (((((flags & 1U) != 0) && ((tab_bar->Flags & 1) == 0)) &&
          (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < (long)__nmemb)) &&
         (tab_bar->PrevFrameVisible != -1)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x1c,TabItemComparerByVisibleOffset);
      }
      uVar8 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar8 = flags;
      }
      tab_bar->Flags = uVar8;
      IVar4 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar4;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
      tab_bar->CurrFrameVisible = pIVar5->FrameCount;
      local_40.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
      local_40.x = tab_bar->OffsetMax;
      ItemSize(&local_40,0.0);
      (pIVar3->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      col = GetColorU32(uVar8 >> 0x15 & 2 | 0x21,1.0);
      local_40.x = 0.0;
      if ((uVar8 >> 0x15 & 1) == 0) {
        local_40.x = (pIVar3->WindowPadding).x;
      }
      local_40.x = (tab_bar->BarRect).Min.x - local_40.x;
      local_40.y = (tab_bar->BarRect).Max.y + -1.0;
      local_38.x = 0.0;
      if ((uVar8 >> 0x15 & 1) == 0) {
        local_38.x = (pIVar3->WindowPadding).x;
      }
      local_38.x = (tab_bar->BarRect).Max.x + local_38.x;
      local_38.y = local_40.y;
      ImDrawList::AddLine(pIVar3->DrawList,&local_40,&local_38,col,1.0);
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        window->IDStack.push_back(tab_bar->ID);

    g.CurrentTabBar.push_back(tab_bar);
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order. 
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;

    // Layout    
    ItemSize(ImVec2(tab_bar->OffsetMax, tab_bar->BarRect.GetHeight()));
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_Tab);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - ((flags & ImGuiTabBarFlags_DockNodeIsDockSpace) ? 0.0f : window->WindowPadding.x);
        const float separator_max_x = tab_bar->BarRect.Max.x + ((flags & ImGuiTabBarFlags_DockNodeIsDockSpace) ? 0.0f : window->WindowPadding.x);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}